

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O1

void Imf_3_4::loadFlatScanLineImage(string *fileName,Header *hdr,FlatImage *img)

{
  char *pcVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  undefined8 uVar6;
  FlatImageLevel *this;
  iterator iVar7;
  Iterator IVar8;
  InputFile in;
  FrameBuffer fb;
  undefined1 local_c0 [24];
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  string local_98;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  local_60;
  undefined4 extraout_var;
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)local_c0,pcVar1,iVar3);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::channels();
  Image::clearChannels(&img->super_Image);
  local_a0 = (_Base_ptr)hdr;
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  while( true ) {
    p_Var5 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var4 == p_Var5) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)(p_Var4 + 1),(allocator<char> *)&local_60);
    Image::insertChannel(&img->super_Image,&local_98,(Channel *)(p_Var4 + 9));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  Imf_3_4::InputFile::header();
  p_Var2 = local_a0;
  uVar6 = Imf_3_4::Header::dataWindow();
  (*(img->super_Image)._vptr_Image[2])(img,uVar6,0);
  iVar3 = (*(img->super_Image)._vptr_Image[3])(img,0);
  this = (FlatImageLevel *)CONCAT44(extraout_var,iVar3);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar7._M_node = (_Base_ptr)FlatImageLevel::begin(this);
  while( true ) {
    IVar8 = FlatImageLevel::end(this);
    if ((iterator)iVar7._M_node == IVar8._i._M_node) break;
    (**(code **)(**(long **)(iVar7._M_node + 2) + 0x20))(&local_98);
    Imf_3_4::FrameBuffer::insert((string *)&local_60,(Slice *)(iVar7._M_node + 1));
    iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node);
  }
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_c0);
  Imf_3_4::InputFile::readPixels((int)local_c0,(this->super_ImageLevel)._dataWindow.min.y);
  Imf_3_4::InputFile::header();
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::Header::begin();
  while( true ) {
    Imf_3_4::InputFile::header();
    p_Var5 = (_Rb_tree_node_base *)Imf_3_4::Header::end();
    if (p_Var4 == p_Var5) break;
    iVar3 = strcmp((char *)(p_Var4 + 1),"tiles");
    if (iVar3 != 0) {
      Imf_3_4::Header::insert((char *)p_Var2,(Attribute *)(p_Var4 + 1));
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree(&local_60);
  if (local_a8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  return;
}

Assistant:

void
loadFlatScanLineImage (const string& fileName, Header& hdr, FlatImage& img)
{
    InputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (in.header ().dataWindow (), ONE_LEVEL, ROUND_DOWN);

    FlatImageLevel& level = img.level ();
    FrameBuffer     fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);
    in.readPixels (level.dataWindow ().min.y, level.dataWindow ().max.y);

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        if (strcmp (i.name (), "tiles")) hdr.insert (i.name (), i.attribute ());
    }
}